

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix.c
# Opt level: O0

void isort(uchar **a,int n,int d)

{
  undefined8 uVar1;
  bool bVar2;
  byte *local_38;
  uchar *t;
  uchar *s;
  uchar **pj;
  uchar **pi;
  int d_local;
  int n_local;
  uchar **a_local;
  
  pj = a + 1;
  pi._4_4_ = n;
  do {
    pi._4_4_ = pi._4_4_ + -1;
    if (pi._4_4_ < 1) {
      return;
    }
    for (s = (uchar *)pj; a < s; s = s + -8) {
      t = (uchar *)(*(long *)(s + -8) + (long)d);
      local_38 = (byte *)(*(long *)s + (long)d);
      while( true ) {
        bVar2 = false;
        if (*t == *local_38) {
          bVar2 = *t != '\0';
        }
        if (!bVar2) break;
        t = t + 1;
        local_38 = local_38 + 1;
      }
      if (*t <= *local_38) break;
      uVar1 = *(undefined8 *)s;
      *(undefined8 *)s = *(undefined8 *)(s + -8);
      *(undefined8 *)(s + -8) = uVar1;
    }
    pj = pj + 1;
  } while( true );
}

Assistant:

static
void isort(unsigned char **a, int n, int d)
{
	unsigned char **pi, **pj, *s, *t;
	for (pi = a + 1; --n > 0; pi++)
		for (pj = pi; pj > a; pj--) {
			for (s=*(pj-1)+d, t=*pj+d;
					*s==*t && *s!=0; s++, t++) ;
			if (*s <= *t) break;
			t = *(pj); *(pj) = *(pj-1);
			*(pj-1) = t;
		}
}